

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
Bitmap_Operation::generateGrayScalePallete(void)

{
  pointer __s;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uchar uVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x400;
  __s = (pointer)operator_new(0x400);
  (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = __s;
  lVar2 = 0;
  (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x400;
  memset(__s,0,0x400);
  (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x400;
  do {
    uVar1 = (uchar)lVar2;
    __s[lVar2 * 4] = uVar1;
    __s[lVar2 * 4 + 1] = uVar1;
    __s[lVar2 * 4 + 2] = uVar1;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + -4;
  } while (lVar3 != 0);
  return in_RDI;
}

Assistant:

std::vector< uint8_t > generateGrayScalePallete()
    {
        std::vector< uint8_t > pallete( 1024u, 0 );

        uint8_t * palleteData = pallete.data();
        uint8_t * palleteEnd = palleteData + pallete.size();

        for( uint8_t i = 0; palleteData != palleteEnd; ++i, ++palleteData ) {
            *palleteData++ = i;
            *palleteData++ = i;
            *palleteData++ = i;
        }

        return pallete;
    }